

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O2

bool __thiscall
HighsSplitDeque::leapfrogStolenTask(HighsSplitDeque *this,HighsTask *task,HighsSplitDeque **stealer)

{
  bool bVar1;
  HighsSplitDeque *pHVar2;
  HighsTask *task_00;
  bool cancelled;
  bool local_19;
  
  pHVar2 = HighsTask::getStealerIfUnfinished(task,&local_19);
  *stealer = pHVar2;
  if (pHVar2 == (HighsSplitDeque *)0x0) {
    bVar1 = true;
  }
  else {
    if (local_19 == false) {
      do {
        task_00 = stealWithRetryLoop(*stealer);
        if (task_00 == (HighsTask *)0x0) break;
        runStolenTask(this,task_00);
      } while (((task->metadata).stealer.super___atomic_base<unsigned_long>._M_i & 1) == 0);
    }
    bVar1 = (bool)((byte)(task->metadata).stealer.super___atomic_base<unsigned_long>._M_i & 1);
  }
  return bVar1;
}

Assistant:

bool leapfrogStolenTask(HighsTask* task, HighsSplitDeque*& stealer) {
    bool cancelled;
    stealer = task->getStealerIfUnfinished(&cancelled);

    if (stealer == nullptr) return true;

    if (!cancelled) {
      do {
        HighsTask* t = stealer->stealWithRetryLoop();
        if (t == nullptr) break;
        runStolenTask(t);
      } while (!task->isFinished());
    }

    return task->isFinished();
  }